

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O2

void __thiscall
AI::HierarchicalTaskNetworkComponent::HierarchicalTaskNetworkComponent
          (HierarchicalTaskNetworkComponent *this,Actor *owner)

{
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  *this_00;
  uint uVar1;
  mapped_type *pmVar2;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  Component::Component(&this->super_Component,owner);
  (this->super_Component)._vptr_Component = (_func_int **)&PTR_initializeComponent_0014dcf0;
  (this->super_IFixedTickable)._vptr_IFixedTickable = (_func_int **)&DAT_0014dd10;
  this->frameCount = 0;
  Planner::Planner(&this->planner);
  WorldState::WorldState(&this->state);
  std::_Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>::_Deque_base
            (&(this->taskHistory).
              super__Deque_base<AI::TaskIdentifier,_std::allocator<AI::TaskIdentifier>_>);
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->eng,(ulong)uVar1);
  std::random_device::~random_device((random_device *)&local_13b8.field_0);
  (this->utilities).super__Vector_base<AI::Utility,_std::allocator<AI::Utility>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->utilityIterator)._M_current = (Utility *)0x0;
  (this->utilities).super__Vector_base<AI::Utility,_std::allocator<AI::Utility>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->utilities).super__Vector_base<AI::Utility,_std::allocator<AI::Utility>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->currentGoalName)._M_dataplus._M_p = (pointer)&(this->currentGoalName).field_2;
  (this->currentGoalName)._M_string_length = 0;
  (this->currentGoalName).field_2._M_local_buf[0] = '\0';
  (this->currentTaskName)._M_dataplus._M_p = (pointer)&(this->currentTaskName).field_2;
  (this->currentTaskName)._M_string_length = 0;
  (this->currentTaskName).field_2._M_local_buf[0] = '\0';
  (this->planPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->planPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->planPath).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->barker).timeRemaining = 0.0;
  (this->barker).barking = false;
  (this->barker).speech._M_dataplus._M_p = (pointer)&(this->barker).speech.field_2;
  (this->barker).speech._M_string_length = 0;
  (this->barker).speech.field_2._M_local_buf[0] = '\0';
  (this->utilityScores).super__Vector_base<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->utilityScores).super__Vector_base<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->utilityScores).super__Vector_base<AI::FUtilityScores,_std::allocator<AI::FUtilityScores>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->detailSightRadius = 800.0;
  this->detailAngle = 20.0;
  this->motionSightRadius = 1600.0;
  this->motionAngle = 40.0;
  this_00 = &(this->state).current.vectors;
  local_13b8._M_mt._M_x[0]._0_4_ = 5;
  pmVar2 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](this_00,(key_type *)&local_13b8);
  pmVar2->x = 0.0;
  pmVar2->y = 0.0;
  pmVar2->z = 0.0;
  local_13b8._M_mt._M_x[0]._0_4_ = 7;
  pmVar2 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](this_00,(key_type *)&local_13b8);
  pmVar2->x = 1000.0;
  pmVar2->y = 1000.0;
  pmVar2->z = 1000.0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->planPath,5);
  return;
}

Assistant:

HierarchicalTaskNetworkComponent::HierarchicalTaskNetworkComponent(Actor* owner)
	: Component(owner)
{
	detailSightRadius = 800.f;
	motionSightRadius = 1600.f;

	detailAngle = 20.f;
	motionAngle = detailAngle * 2.f;

	state.current.vectors[WorldStateIdentifier::CurrentPosition] = {};
	state.current.vectors[WorldStateIdentifier::PlayerPosition] = {1000, 1000, 1000};

	planPath.resize(5);
}